

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddFunctionCall
          (InstructionBuilder *this,uint32_t result_type,uint32_t function,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *parameters)

{
  pointer puVar1;
  InstructionBuilder *this_00;
  uint32_t res_id;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_01;
  Instruction *pIVar2;
  pointer puVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint local_b8;
  uint32_t local_b4;
  InstructionBuilder *local_b0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_b8;
  local_b8 = function;
  local_b4 = result_type;
  local_b0 = this;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_88.type = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&operands,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  puVar1 = (parameters->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (parameters->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start; this_00 = local_b0, puVar3 != puVar1;
      puVar3 = puVar3 + 1) {
    local_b8 = *puVar3;
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
    local_88.type = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&operands,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  res_id = IRContext::TakeNextId(local_b0->context_);
  if (res_id == 0) {
    pIVar2 = (Instruction *)0x0;
  }
  else {
    this_01._M_head_impl = (Instruction *)::operator_new(0x70);
    Instruction::Instruction
              (this_01._M_head_impl,this_00->context_,OpFunctionCall,local_b4,res_id,&operands);
    local_88._0_8_ = this_01._M_head_impl;
    pIVar2 = AddInstruction(this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                     *)&local_88);
    if ((Instruction *)local_88._0_8_ != (Instruction *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands);
  return pIVar2;
}

Assistant:

Instruction* AddFunctionCall(uint32_t result_type, uint32_t function,
                               const std::vector<uint32_t>& parameters) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {function}});
    for (uint32_t id : parameters) {
      operands.push_back({SPV_OPERAND_TYPE_ID, {id}});
    }

    uint32_t result_id = GetContext()->TakeNextId();
    if (result_id == 0) {
      return nullptr;
    }
    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpFunctionCall, result_type,
                        result_id, operands));
    return AddInstruction(std::move(new_inst));
  }